

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

function<bool_(const_void_*,_void_*)> * __thiscall
QMetaTypeFunctionRegistry<std::function<bool_(const_void_*,_void_*)>,_std::pair<int,_int>_>::
function(QMetaTypeFunctionRegistry<std::function<bool_(const_void_*,_void_*)>,_std::pair<int,_int>_>
         *this,pair<int,_int> k)

{
  long lVar1;
  bool bVar2;
  function<bool_(const_void_*,_void_*)> *pfVar3;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  QReadLocker locker;
  pair<int,_int> *in_stack_ffffffffffffffa8;
  const_iterator *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QReadLocker::QReadLocker
            ((QReadLocker *)in_stack_ffffffffffffffb0,(QReadWriteLock *)in_stack_ffffffffffffffa8);
  QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>::find
            ((QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *)
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>::end
            ((QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *)in_RDI);
  bVar2 = QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>::const_iterator::
          operator==(in_RDI,in_stack_ffffffffffffffb0);
  if (bVar2) {
    pfVar3 = (function<bool_(const_void_*,_void_*)> *)0x0;
  }
  else {
    pfVar3 = QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>::const_iterator
             ::operator*((const_iterator *)0x3a6ef5);
  }
  QReadLocker::~QReadLocker((QReadLocker *)0x3a6f0d);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pfVar3;
  }
  __stack_chk_fail();
}

Assistant:

const T *function(Key k) const
    {
        const QReadLocker locker(&lock);
        auto it = map.find(k);
        return it == map.end() ? nullptr : std::addressof(*it);
    }